

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  uint uVar1;
  int iVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ulong uVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  undefined4 extraout_var;
  int iVar6;
  U32 UVar7;
  U32 UVar8;
  uint uVar9;
  long lVar10;
  BYTE *ip;
  BYTE *ip_00;
  bool bVar11;
  
  bVar11 = (params->ldmParams).enableLdm != 0;
  iend = (BYTE *)((long)src + srcSize);
  uVar5 = 0xdfffffff;
  if (srcSize < 0xdfffffff) {
    uVar5 = srcSize;
  }
  if (srcSize < 0x20000000) {
    uVar5 = srcSize;
  }
  ip_00 = iend + -0xdfffffff;
  if (srcSize >> 0x1d < 7) {
    ip_00 = (BYTE *)src;
  }
  if (uVar5 != 0) {
    pBVar3 = (ms->window).nextSrc;
    if (pBVar3 != ip_00) {
      pBVar4 = (ms->window).base;
      lVar10 = (long)pBVar3 - (long)pBVar4;
      UVar8 = (ms->window).dictLimit;
      (ms->window).lowLimit = UVar8;
      UVar7 = (U32)lVar10;
      (ms->window).dictLimit = UVar7;
      (ms->window).dictBase = pBVar4;
      (ms->window).base = ip_00 + -lVar10;
      if (UVar7 - UVar8 < 8) {
        (ms->window).lowLimit = UVar7;
      }
    }
    pBVar3 = ip_00 + uVar5;
    (ms->window).nextSrc = pBVar3;
    pBVar4 = (ms->window).dictBase;
    uVar1 = (ms->window).dictLimit;
    if (ip_00 < pBVar4 + uVar1 && pBVar4 + (ms->window).lowLimit < pBVar3) {
      uVar9 = (uint)((long)pBVar3 - (long)pBVar4);
      if ((long)(ulong)uVar1 < (long)pBVar3 - (long)pBVar4) {
        uVar9 = uVar1;
      }
      (ms->window).lowLimit = uVar9;
    }
  }
  iVar2 = params->forceWindow;
  UVar8 = 0;
  iVar6 = (int)iend;
  if (iVar2 == 0) {
    UVar8 = iVar6 - *(int *)&(ms->window).base;
  }
  ms->loadedDictEnd = UVar8;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (ls != (ldmState_t *)0x0 && bVar11) {
    if (uVar5 != 0) {
      pBVar3 = (ls->window).nextSrc;
      if (pBVar3 != ip_00) {
        pBVar4 = (ls->window).base;
        lVar10 = (long)pBVar3 - (long)pBVar4;
        UVar8 = (ls->window).dictLimit;
        (ls->window).lowLimit = UVar8;
        UVar7 = (U32)lVar10;
        (ls->window).dictLimit = UVar7;
        (ls->window).dictBase = pBVar4;
        (ls->window).base = ip_00 + -lVar10;
        if (UVar7 - UVar8 < 8) {
          (ls->window).lowLimit = UVar7;
        }
      }
      pBVar3 = ip_00 + uVar5;
      (ls->window).nextSrc = pBVar3;
      pBVar4 = (ls->window).dictBase;
      uVar1 = (ls->window).dictLimit;
      if (ip_00 < pBVar4 + uVar1 && pBVar4 + (ls->window).lowLimit < pBVar3) {
        uVar9 = (uint)((long)pBVar3 - (long)pBVar4);
        if ((long)(ulong)uVar1 < (long)pBVar3 - (long)pBVar4) {
          uVar9 = uVar1;
        }
        (ls->window).lowLimit = uVar9;
      }
    }
    UVar8 = 0;
    if (iVar2 == 0) {
      UVar8 = iVar6 - *(int *)&(ls->window).base;
    }
    ls->loadedDictEnd = UVar8;
  }
  if (8 < uVar5) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip_00,iend);
    if (ls != (ldmState_t *)0x0 && bVar11) {
      ZSTD_ldm_fillHashTable(ls,ip_00,iend,&params->ldmParams);
    }
    uVar5 = (ulong)((params->cParams).strategy - ZSTD_fast);
    switch(uVar5) {
    case 0:
      ZSTD_fillHashTable(ms,iend,dtlm);
      uVar5 = extraout_RAX_02;
      break;
    case 1:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm);
      uVar5 = extraout_RAX_03;
      break;
    case 2:
    case 3:
    case 4:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
          memset(ms->tagTable,0,2L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          uVar5 = extraout_RAX_01;
        }
        else {
          UVar8 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          uVar5 = CONCAT44(extraout_var,UVar8);
        }
      }
      else {
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        uVar5 = extraout_RAX_00;
      }
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      ZSTD_updateTree(ms,iend + -8,iend);
      uVar5 = extraout_RAX;
    }
    ms->nextToUpdate = iVar6 - *(int *)&(ms->window).base;
  }
  return uVar5;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm && ls != NULL;

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 const maxDictSize = ZSTD_CURRENT_MAX - 1;
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict)
            assert(ZSTD_window_isEmpty(ls->window));
        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (loadLdmDict) {
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
    }

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    if (loadLdmDict)
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_urm_auto);
            if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog) * sizeof(U16);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}